

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve.cpp
# Opt level: O1

ExprPtr __thiscall mathiu::impl::solve(impl *this,ExprPtr *ex,ExprPtr *var,ExprPtr *domain)

{
  _Atomic_word *p_Var1;
  _Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false> *idPat;
  pointer pcVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  impl *piVar4;
  ExprPtr *var_00;
  bool bVar5;
  enable_if_t<isTupleLikeV<const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_&>,_bool>
  eVar6;
  ostream *poVar7;
  variant_alternative_t<2UL,_variant<int,_Fraction,_Symbol,_Pi,_E,_I,_Infinity,_Sum,_Product,_Power,_Log,_Sin,_Arctan,_Set,_List,_tuple<RelationalKind,_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>,_PieceWise,_Pair,_pair<pair<shared_ptr<const_Expr>,_bool>,_pair<shared_ptr<const_Expr>,_bool>_>,_True,_False,_Logical,_SetOp>_>
  *pvVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar9;
  variant_alternative_t<1UL,_variant<monostate,_const_tuple<RelationalKind,_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_*,_const_int_*,_const_Product_*,_const_PieceWise_*,_bool>_>
  *value;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>_&>
  pIVar10;
  shared_ptr<const_mathiu::impl::Expr> *lhs;
  shared_ptr<const_mathiu::impl::Expr> *rhs;
  variant_alternative_t<2UL,_variant<monostate,_const_tuple<RelationalKind,_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_*,_const_int_*,_const_Product_*,_const_PieceWise_*,_bool>_>
  *value_00;
  variant_alternative_t<3UL,_variant<monostate,_const_tuple<RelationalKind,_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_*,_const_int_*,_const_Product_*,_const_PieceWise_*,_bool>_>
  *value_01;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>_&>
  pIVar11;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>_&>
  pPVar12;
  _Compatible_tree<mathiu::impl::ExprPtrLess> *__src;
  size_t *psVar13;
  _Base_ptr p_Var14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  _Atomic_word *p_Var16;
  variant_alternative_t<4UL,_variant<monostate,_const_tuple<RelationalKind,_shared_ptr<const_Expr>,_shared_ptr<const_Expr>_>_*,_const_int_*,_const_Product_*,_const_PieceWise_*,_bool>_>
  *value_02;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>,_std::variant<matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>_&>
  pIVar17;
  __visit_result_t<matchit::impl::Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>,_const_std::variant<std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>_&>
  pPVar18;
  ExprPtr *ex_00;
  ExprPtr *ex_01;
  ExprPtr *ex_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var19;
  IdProcess IVar20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Rb_tree_header *p_Var21;
  pointer ex_03;
  undefined1 auVar22 [8];
  ExprPtr EVar23;
  Set solutionSet;
  Symbol var_;
  ContextT context;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> iE2;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> iE1;
  Id<mathiu::impl::PieceWise> iPieceWise;
  Id<mathiu::impl::Product> iP;
  IdProcess local_a04;
  undefined1 local_9e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_9e0;
  _Base_ptr local_9d8;
  _Base_ptr local_9d0;
  _Base_ptr p_Stack_9c8;
  size_t local_9c0;
  impl *local_9b8;
  impl *local_9b0;
  impl *local_9a8;
  pointer local_9a0;
  undefined1 local_998 [8];
  undefined8 uStack_990;
  _Base_ptr local_988;
  _Base_ptr local_980;
  _Base_ptr p_Stack_978;
  size_t local_970;
  long *local_968 [2];
  long local_958 [2];
  undefined1 local_948 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_940;
  _Base_ptr local_938;
  _Base_ptr p_Stack_930;
  _Base_ptr local_928;
  size_t sStack_920;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_918;
  undefined1 auStack_910 [16];
  undefined1 local_900 [72];
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_8b8;
  undefined8 uStack_8b0;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_8a8;
  undefined8 uStack_8a0;
  long local_858;
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_848;
  variant<int,_mathiu::impl::Fraction,_mathiu::impl::Symbol,_mathiu::impl::Pi,_mathiu::impl::E,_mathiu::impl::I,_mathiu::impl::Infinity,_mathiu::impl::Sum,_mathiu::impl::Product,_mathiu::impl::Power,_mathiu::impl::Log,_mathiu::impl::Sin,_mathiu::impl::Arctan,_mathiu::impl::Set,_mathiu::impl::List,_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::PieceWise,_mathiu::impl::Pair,_std::pair<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_mathiu::impl::True,_mathiu::impl::False,_mathiu::impl::Logical,_mathiu::impl::SetOp>
  *local_818;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_810;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_808;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> local_800;
  long lStack_7f8;
  Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_7f0;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_798;
  undefined8 uStack_790;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_788;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  *local_778;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  *local_770;
  ExprPtr *local_768;
  impl *local_760;
  impl local_758 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_750;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_748;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> local_740;
  long lStack_738;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_730;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_6e8;
  undefined8 uStack_6e0;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_6d8;
  Id<mathiu::impl::Product> *local_6c8;
  pointer local_6c0;
  impl *local_6b8;
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  undefined1 *local_6a0;
  int local_698;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_690;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_680;
  impl *local_670;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_668;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> local_660;
  undefined8 uStack_658;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_650;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_620;
  App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
  local_610;
  Id<mathiu::impl::PieceWise> *local_600;
  ExprPtr *local_5f8;
  impl *local_5f0;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_5e8;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> local_5e0;
  undefined8 uStack_5d8;
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_5d0;
  RelationalKind local_580;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_578;
  undefined8 uStack_570;
  anon_class_1_0_00000001 *local_568;
  InternalPatternT<bool> IStack_560;
  undefined7 uStack_55f;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> local_558;
  undefined8 uStack_550;
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_548;
  undefined4 local_4f8;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_4f0;
  undefined8 uStack_4e8;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_4e0;
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_4b8;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_490;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> local_488;
  undefined8 uStack_480;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_478;
  anon_class_1_0_00000001 *local_448;
  InternalPatternT<bool> IStack_440;
  undefined7 uStack_43f;
  anon_class_1_0_00000001 *local_438;
  InternalPatternT<bool> IStack_430;
  undefined7 uStack_42f;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_428;
  undefined1 local_3f8 [40];
  __index_type local_3d0;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_3c8;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> local_3c0;
  undefined8 uStack_3b8;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_3b0;
  anon_class_1_0_00000001 *local_380;
  InternalPatternT<bool> IStack_378;
  undefined7 uStack_377;
  anon_class_1_0_00000001 *local_370;
  InternalPatternT<bool> IStack_368;
  undefined7 uStack_367;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_360;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> local_358;
  undefined8 uStack_350;
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_348;
  RelationalKind local_2f8;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_2f0;
  undefined8 uStack_2e8;
  anon_class_1_0_00000001 *local_2e0;
  InternalPatternT<bool> IStack_2d8;
  undefined7 uStack_2d7;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_2d0;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> local_2c8;
  undefined8 uStack_2c0;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_2b8;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_270;
  undefined8 uStack_268;
  anon_class_1_0_00000001 *local_260;
  InternalPatternT<bool> IStack_258;
  undefined7 uStack_257;
  Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  local_250;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> local_1f8;
  undefined8 uStack_1f0;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  local_1e8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_1a8;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> local_1a0;
  undefined8 uStack_198;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_190;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_148;
  undefined8 uStack_140;
  anon_class_1_0_00000001 *local_138;
  InternalPatternT<bool> IStack_130;
  undefined7 uStack_12f;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_128;
  undefined1 local_e0 [64];
  __index_type local_a0;
  _Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*> local_98;
  undefined8 uStack_90;
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  local_88;
  _Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
  local_40;
  undefined8 uStack_38;
  
  local_9b0 = (impl *)domain;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"solve: ",7);
  toString_abi_cxx11_((string *)&local_918,(impl *)ex,ex_00);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_918,auStack_910._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,",\t",2);
  toString_abi_cxx11_((string *)&local_808,(impl *)var,ex_01);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(char *)local_808,(long)local_800);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,",\t",2);
  toString_abi_cxx11_((string *)&local_748,local_9b0,ex_02);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(char *)local_748,(long)local_740);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (local_748 !=
      (_Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
       )&lStack_738) {
    operator_delete((void *)local_748,lStack_738 + 1);
  }
  if (local_808 !=
      (_Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
       )&lStack_7f8) {
    operator_delete((void *)local_808,lStack_7f8 + 1);
  }
  if (local_918 !=
      (_Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
       )((long)auStack_910 + 8)) {
    operator_delete((void *)local_918,auStack_910._8_8_ + 1);
  }
  pvVar8 = std::
           get<2ul,int,mathiu::impl::Fraction,mathiu::impl::Symbol,mathiu::impl::Pi,mathiu::impl::E,mathiu::impl::I,mathiu::impl::Infinity,mathiu::impl::Sum,mathiu::impl::Product,mathiu::impl::Power,mathiu::impl::Log,mathiu::impl::Sin,mathiu::impl::Arctan,mathiu::impl::Set,mathiu::impl::List,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,mathiu::impl::PieceWise,mathiu::impl::Pair,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,mathiu::impl::True,mathiu::impl::False,mathiu::impl::Logical,mathiu::impl::SetOp>
                     (&((var->
                        super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->super_ExprVariant);
  local_968[0] = local_958;
  pcVar2 = (pvVar8->
           super_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
           )._M_elems[0]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_968,pcVar2,
             pcVar2 + (pvVar8->
                      super_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
                      )._M_elems[0]._M_string_length);
  local_918._0_4_ = 0;
  auStack_910._0_8_ = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)0x0;
  auStack_910._8_8_ = 0;
  local_900._0_8_ = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*>)0x0;
  local_900._8_8_ = 0;
  local_900._16_8_ = 0;
  local_900._24_8_ = 0;
  local_900._32_8_ = 0;
  local_e0._0_4_ = 0;
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>
                     *)(local_e0 + 8),
                    (_Move_ctor_base<false,_std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>
                     *)auStack_910);
  local_a0 = '\0';
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Product,_mathiu::impl::Product_*,_const_mathiu::impl::Product_*>
                       *)auStack_910);
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_4b8);
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_4e0);
  local_918 = (_Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
               )((ulong)(uint)local_918._4_4_ << 0x20);
  auStack_910._0_8_ = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)0x0;
  auStack_910._8_8_ = 0;
  local_900._0_8_ = (_Variadic_union<matchit::impl::IdBlock<mathiu::impl::Product>_*>)0x0;
  local_900._8_8_ = 0;
  local_3f8._0_4_ = 0;
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>
                     *)(local_3f8 + 8),
                    (_Move_ctor_base<false,_std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>
                     *)auStack_910);
  local_3d0 = '\0';
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>
  ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::PieceWise,_mathiu::impl::PieceWise_*,_const_mathiu::impl::PieceWise_*>
                       *)auStack_910);
  std::
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::_Tuple_impl((_Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 *)&local_250,(Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_4b8,
                (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_4e0);
  local_250.mPatterns.
  super__Tuple_impl<0UL,_mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Head_base<0UL,_mathiu::impl::RelationalKind,_false>._M_head_impl = kEQUAL;
  matchit::impl::
  as<std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>
  ::{lambda(auto:1)#1}::operator()
            ((App<const_matchit::impl::AsPointer<std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Ds<mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>_>_>_>
              *)&local_558._M_first,
             (_lambda_auto_1__1_ *)
             &matchit::impl::
              as<std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>>
             ,&local_250);
  local_918 = (_Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
               )&matchit::impl::deref;
  auStack_910._0_8_ = local_558;
  auStack_910._8_8_ = uStack_550;
  std::
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::_Tuple_impl((_Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 *)local_900,&local_548);
  uStack_8b0 = CONCAT44(uStack_8b0._4_4_,local_4f8);
  local_8a8 = local_4f0;
  uStack_8a0 = uStack_4e8;
  local_5e8 = local_918;
  local_5e0 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)
              auStack_910._0_8_;
  uStack_5d8 = auStack_910._8_8_;
  local_9b8 = this;
  std::
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::_Tuple_impl(&local_5d0,
                (_Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 *)local_900);
  local_580 = (RelationalKind)uStack_8b0;
  local_578 = local_8a8;
  uStack_570 = uStack_8a0;
  local_568 = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  IStack_560 = true;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)(local_900 + 0x28));
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)local_900);
  local_360 = local_5e8;
  local_358 = local_5e0;
  uStack_350 = uStack_5d8;
  std::
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::_Tuple_impl(&local_348,&local_5d0);
  local_2f8 = local_580;
  local_2f0 = local_578;
  uStack_2e8 = uStack_570;
  uStack_2d7 = uStack_55f;
  IStack_2d8 = IStack_560;
  local_2e0 = local_568;
  local_808 = local_360;
  local_800 = local_358;
  lStack_7f8 = uStack_350;
  std::
  _Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::_Tuple_impl((_Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 *)&local_7f0,&local_348);
  local_7f0.mPatterns.
  super__Tuple_impl<0UL,_mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  .super__Head_base<0UL,_mathiu::impl::RelationalKind,_false>._M_head_impl = local_2f8;
  local_798 = local_2f0;
  uStack_790 = uStack_2e8;
  local_788.mUnary = local_2e0;
  local_788.mPattern = IStack_2d8;
  local_788._9_7_ = uStack_2d7;
  local_760 = local_9b0;
  local_778 = &local_4b8;
  local_770 = &local_4e0;
  local_768 = var;
  set<std::shared_ptr<mathiu::impl::Expr_const>const&>(local_758,var);
  local_6b0 = &matchit::impl::deref;
  local_6a8 = &matchit::impl::asPointer<int>;
  local_6a0 = &matchit::impl::deref;
  local_698 = 0;
  local_690.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_690.mPattern = true;
  local_680.mUnary = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  local_680.mPattern = true;
  auStack_910._8_8_ = (_func_int **)0x0;
  local_918 = (_Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
               )0x0;
  auStack_910._0_8_ = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)0x0;
  local_900._16_8_ = 0;
  local_900._0_8_ = auStack_910;
  local_900._8_8_ = auStack_910;
  local_670 = local_758;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00253718;
  p_Var1 = &this_00[1]._M_use_count;
  if ((_func_int **)auStack_910._8_8_ == (_func_int **)0x0) {
    this_00[1]._M_use_count = 0;
    this_00[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(_Atomic_word **)&this_00[2]._M_use_count = p_Var1;
    this_00[3]._vptr__Sp_counted_base = (_func_int **)p_Var1;
    p_Var16 = &this_00[3]._M_use_count;
  }
  else {
    p_Var16 = (_Atomic_word *)(local_900 + 0x10);
    this_00[1]._M_use_count = auStack_910._0_4_;
    this_00[2]._vptr__Sp_counted_base = (_func_int **)auStack_910._8_8_;
    this_00[2]._M_use_count = local_900._0_4_;
    this_00[2]._M_weak_count = local_900._4_4_;
    this_00[3]._vptr__Sp_counted_base = (_func_int **)local_900._8_8_;
    *(_Atomic_word **)(auStack_910._8_8_ + 8) = p_Var1;
    this_00[3]._M_use_count = local_900._16_4_;
    this_00[3]._M_weak_count = local_900._20_4_;
    auStack_910._8_8_ = (_func_int **)0x0;
    local_900._0_8_ = auStack_910;
    local_900._8_8_ = auStack_910;
  }
  *(undefined8 *)p_Var16 = 0;
  *(undefined1 *)&this_00[4]._M_use_count = 0xd;
  std::
  _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
  ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
               *)&local_918);
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)&local_128,(Id<mathiu::impl::Product> *)local_e0);
  matchit::impl::as<mathiu::impl::Product>::{lambda(auto:1)#1}::operator()
            ((App<const_matchit::impl::AsPointer<mathiu::impl::Product>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Product>_>_>_>
              *)&local_98._M_first,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Product>,
             (Id<mathiu::impl::Product> *)&local_128);
  local_918 = (_Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
               )&matchit::impl::deref;
  auStack_910._0_8_ = local_98;
  auStack_910._8_8_ = uStack_90;
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)local_900,(Id<mathiu::impl::Product> *)&local_88);
  local_8b8 = local_40;
  uStack_8b0 = uStack_38;
  local_2d0 = local_918;
  local_2c8 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)
              auStack_910._0_8_;
  uStack_2c0 = auStack_910._8_8_;
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)&local_2b8,(Id<mathiu::impl::Product> *)local_900);
  local_270 = local_8b8;
  uStack_268 = uStack_8b0;
  local_260 = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  IStack_258 = true;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                       *)local_900);
  local_1a8 = local_2d0;
  local_1a0 = local_2c8;
  uStack_198 = uStack_2c0;
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)&local_190,(Id<mathiu::impl::Product> *)&local_2b8);
  local_148 = local_270;
  uStack_140 = uStack_268;
  uStack_12f = uStack_257;
  IStack_130 = IStack_258;
  local_138 = local_260;
  local_748 = local_1a8;
  local_740 = local_1a0;
  lStack_738 = uStack_198;
  matchit::impl::Id<mathiu::impl::Product>::Id
            ((Id<mathiu::impl::Product> *)&local_730,(Id<mathiu::impl::Product> *)&local_190);
  local_6e8 = local_148;
  uStack_6e0 = uStack_140;
  local_6d8.mUnary = local_138;
  local_6d8.mPattern = IStack_130;
  local_6d8._9_7_ = uStack_12f;
  local_6b8 = local_9b0;
  local_6c8 = (Id<mathiu::impl::Product> *)local_e0;
  local_6c0 = (pointer)var;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id
            ((Id<mathiu::impl::PieceWise> *)&local_428,(Id<mathiu::impl::PieceWise> *)local_3f8);
  matchit::impl::as<mathiu::impl::PieceWise>::{lambda(auto:1)#1}::operator()
            ((App<const_matchit::impl::AsPointer<mathiu::impl::PieceWise>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::PieceWise>_>_>_>
              *)&local_1f8._M_first,
             (_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::PieceWise>,
             (Id<mathiu::impl::PieceWise> *)&local_428);
  local_918 = (_Variadic_union<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
               )&matchit::impl::deref;
  auStack_910._0_8_ = local_1f8;
  auStack_910._8_8_ = uStack_1f0;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id
            ((Id<mathiu::impl::PieceWise> *)local_900,(Id<mathiu::impl::PieceWise> *)&local_1e8);
  local_900._48_8_ = local_1b8;
  local_900._56_8_ = uStack_1b0;
  local_490 = local_918;
  local_488 = (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)
              auStack_910._0_8_;
  uStack_480 = auStack_910._8_8_;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id
            ((Id<mathiu::impl::PieceWise> *)&local_478,(Id<mathiu::impl::PieceWise> *)local_900);
  local_448 = (anon_class_1_0_00000001 *)local_900._48_8_;
  _IStack_440 = local_900._56_8_;
  local_438 = (anon_class_1_0_00000001 *)&matchit::impl::cast<bool>;
  IStack_430 = true;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                       *)local_900);
  local_3c8 = local_490;
  local_3c0 = local_488;
  uStack_3b8 = uStack_480;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id
            ((Id<mathiu::impl::PieceWise> *)&local_3b0,(Id<mathiu::impl::PieceWise> *)&local_478);
  local_380 = local_448;
  IStack_378 = IStack_440;
  uStack_377 = uStack_43f;
  uStack_367 = uStack_42f;
  IStack_368 = IStack_430;
  local_370 = local_438;
  local_668 = local_3c8;
  local_660 = local_3c0;
  uStack_658 = uStack_3b8;
  matchit::impl::Id<mathiu::impl::PieceWise>::Id
            ((Id<mathiu::impl::PieceWise> *)&local_650,(Id<mathiu::impl::PieceWise> *)&local_3b0);
  local_620.mUnary = local_380;
  local_620.mPattern = IStack_378;
  local_620._9_7_ = uStack_377;
  local_610.mUnary = local_370;
  local_610.mPattern = IStack_368;
  local_610._9_7_ = uStack_367;
  local_5f0 = local_9b0;
  local_600 = (Id<mathiu::impl::PieceWise> *)local_3f8;
  local_5f8 = var;
  memset(&local_918,0,200);
  lVar9 = 8;
  do {
    *(undefined1 *)((long)&local_918 + lVar9) = 0;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 200);
  local_858 = 0;
  bVar5 = matchit::impl::
          PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
          ::
          matchPatternImpl<std::shared_ptr<mathiu::impl::Expr_const>const&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                    (ex,&local_788,1,
                     (Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
                      *)&local_918);
  if (bVar5) {
    local_9e8 = (undefined1  [8])
                (ex->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
    if ((char)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_9e8 + 0x30))->
              _M_use_count != '\x0f') {
      local_9e8 = (undefined1  [8])(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    std::
    variant<std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
    ::operator=((variant<std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
                 *)(&local_918 + local_858 * 2),
                (tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
                 **)local_9e8);
    lVar9 = local_858 * 2;
    local_858 = local_858 + 1;
    value = std::
            get<1ul,std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
                      ((variant<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                        *)(&local_918 + lVar9));
    bVar5 = matchit::impl::
            PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
            ::
            matchPatternImpl<std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                      (value,(App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
                              *)&local_798,4,
                       (Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
                        *)&local_918);
    if (bVar5) {
      eVar6 = matchit::impl::
              matchPattern<std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const&,matchit::impl::Ds<mathiu::impl::RelationalKind,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                        (*value,&local_7f0,5,
                         (Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
                          *)&local_918);
      IVar20 = (IdProcess)eVar6;
      matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
      processIdImpl(&local_7f0.mPatterns.
                     super__Tuple_impl<0UL,_mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                     .
                     super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                     .
                     super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                     ._M_head_impl,4,(uint)eVar6);
      matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
      processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_7f0,4,(uint)eVar6);
    }
    else {
      IVar20 = kCANCEL;
    }
    idPat = &local_7f0.mPatterns.
             super__Tuple_impl<0UL,_mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
             .
             super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
             .
             super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
    ;
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl(&idPat->_M_head_impl,3,IVar20);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_7f0,3,IVar20);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl(&idPat->_M_head_impl,2,IVar20);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_7f0,2,IVar20);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl(&idPat->_M_head_impl,1,IVar20);
    matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
    processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_7f0,1,IVar20);
  }
  else {
    IVar20 = kCANCEL;
  }
  matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
  processIdImpl(&local_7f0.mPatterns.
                 super__Tuple_impl<0UL,_mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 .
                 super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                 .
                 super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                 ._M_head_impl,0,IVar20);
  matchit::impl::PatternTraits<matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>::
  processIdImpl((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_7f0,0,IVar20);
  if (IVar20 == kCANCEL) {
    _Var19._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    auVar22 = (undefined1  [8])0x0;
  }
  else {
    pIVar10 = std::
              visit<matchit::impl::Overload<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>&)_1_,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*)_1_>,std::variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                          *)local_998,
                         (variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                          *)local_778);
    lhs = (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__deduce_visit_result<const_std::shared_ptr<const_mathiu::impl::Expr>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1186:30),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1187:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1188:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1189:33)>_&&,_const_std::variant<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>_&>
            ::_S_vtable._M_arr
            [*(__index_type *)
              ((long)&(pIVar10->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>).
                      mVariant.
                      super__Variant_base<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                      .
                      super__Move_assign_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                      .
                      super__Copy_assign_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                      .
                      super__Move_ctor_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                      .
                      super__Copy_ctor_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
              + 0x10)]._M_data)
                    ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
                      *)local_998,
                     &(pIVar10->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>).
                      mVariant);
    pIVar10 = std::
              visit<matchit::impl::Overload<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>&)_1_,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>::block()const::_lambda(matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*)_1_>,std::variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>&>
                        ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                          *)local_998,
                         (variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                          *)local_770);
    rhs = (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__deduce_visit_result<const_std::shared_ptr<const_mathiu::impl::Expr>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1186:30),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1187:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1188:33),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O1/_deps/matchit-src/include/matchit.h:1189:33)>_&&,_const_std::variant<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>_&>
            ::_S_vtable._M_arr
            [*(__index_type *)
              ((long)&(pIVar10->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>).
                      mVariant.
                      super__Variant_base<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                      .
                      super__Move_assign_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                      .
                      super__Copy_assign_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                      .
                      super__Move_ctor_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
                      .
                      super__Copy_ctor_alias<std::monostate,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_*,_const_std::shared_ptr<const_mathiu::impl::Expr>_*>
              + 0x10)]._M_data)
                    ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
                      *)local_998,
                     &(pIVar10->super_IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>).
                      mVariant);
    operator-((impl *)&local_848,lhs,rhs);
    expand((impl *)local_9e8,(ExprPtr *)&local_848);
    solve((impl *)local_998,(ExprPtr *)local_9e8,local_768,(ExprPtr *)local_760);
    if (_Stack_9e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_9e0._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        CONCAT44(local_848._M_impl.super__Rb_tree_header._M_header._4_4_,
                 local_848._M_impl.super__Rb_tree_header._M_header._M_color) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(local_848._M_impl.super__Rb_tree_header._M_header._4_4_,
                          local_848._M_impl.super__Rb_tree_header._M_header._M_color));
    }
    _Var19._M_pi = uStack_990;
    auVar22 = local_998;
    local_998 = (undefined1  [8])0x0;
    uStack_990 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  if (IVar20 != kCANCEL) goto LAB_001cec83;
  memset(&local_918,0,200);
  lVar9 = 8;
  do {
    *(undefined1 *)((long)&local_918 + lVar9) = 0;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 200);
  local_858 = 0;
  bVar5 = matchit::impl::
          PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
          ::
          matchPatternImpl<std::shared_ptr<mathiu::impl::Expr_const>const&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                    (ex,&local_680,1,
                     (Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
                      *)&local_918);
  if (bVar5) {
    p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (ex->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_9e8 = (undefined1  [8])(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((char)p_Var15[3]._M_use_count == '\0') {
      local_9e8 = (undefined1  [8])p_Var15;
    }
    std::
    variant<std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
    ::operator=((variant<std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
                 *)(&local_918 + local_858 * 2),(int **)local_9e8);
    lVar9 = local_858 * 2;
    local_858 = local_858 + 1;
    value_00 = std::
               get<2ul,std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
                         ((variant<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                           *)(&local_918 + lVar9));
    bVar5 = matchit::impl::
            PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
            ::
            matchPatternImpl<int_const*&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                      (value_00,&local_690,4,
                       (Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
                        *)&local_918);
    if (!bVar5) goto LAB_001ce3d3;
    bVar5 = local_698 == **value_00;
  }
  else {
LAB_001ce3d3:
    bVar5 = false;
  }
  p_Var15 = _Var19._M_pi;
  if (bVar5) {
    auVar22 = *(undefined1 (*) [8])local_670;
    p_Var15 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_670 + 8);
    if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
      }
    }
    if (_Var19._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var19._M_pi);
    }
  }
  _Var19._M_pi = p_Var15;
  if (!bVar5) {
    bVar5 = freeOf(ex,var);
    p_Var15 = _Var19._M_pi;
    if (bVar5) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      p_Var15 = this_00;
      auVar22 = (undefined1  [8])(this_00 + 1);
      if (_Var19._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var19._M_pi);
      }
    }
    _Var19._M_pi = p_Var15;
    if (!bVar5) {
      memset(&local_918,0,200);
      lVar9 = 8;
      do {
        *(undefined1 *)((long)&local_918 + lVar9) = 0;
        lVar9 = lVar9 + 0x10;
      } while (lVar9 != 200);
      local_858 = 0;
      bVar5 = matchit::impl::
              PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
              ::
              matchPatternImpl<std::shared_ptr<mathiu::impl::Expr_const>const&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                        (ex,&local_6d8,1,
                         (Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
                          *)&local_918);
      if (bVar5) {
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (ex->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
        local_9e8 = (undefined1  [8])(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((char)p_Var15[3]._M_use_count == '\b') {
          local_9e8 = (undefined1  [8])p_Var15;
        }
        std::
        variant<std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
        ::operator=((variant<std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
                     *)(&local_918 + local_858 * 2),(Product **)local_9e8);
        lVar9 = local_858 * 2;
        local_858 = local_858 + 1;
        value_01 = std::
                   get<3ul,std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
                             ((variant<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                               *)(&local_918 + lVar9));
        bVar5 = matchit::impl::
                PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
                ::
                matchPatternImpl<mathiu::impl::Product_const*&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                          (value_01,(App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>
                                     *)&local_6e8,4,
                           (Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
                            *)&local_918);
        if (bVar5) {
          bVar5 = matchit::impl::Id<mathiu::impl::Product>::matchValue<mathiu::impl::Product_const&>
                            ((Id<mathiu::impl::Product> *)&local_730,*value_01);
          local_a04 = (IdProcess)bVar5;
          matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
                    ((Id<mathiu::impl::Product> *)&local_730,5,local_a04);
          matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
                    ((Id<mathiu::impl::Product> *)&local_730,4,local_a04);
        }
        else {
          local_a04 = kCANCEL;
        }
        matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
                  ((Id<mathiu::impl::Product> *)&local_730,3,local_a04);
        matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
                  ((Id<mathiu::impl::Product> *)&local_730,2,local_a04);
        matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
                  ((Id<mathiu::impl::Product> *)&local_730,1,local_a04);
      }
      else {
        local_a04 = kCANCEL;
      }
      matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::Product>_>::processIdImpl
                ((Id<mathiu::impl::Product> *)&local_730,0,local_a04);
      p_Var15 = _Var19._M_pi;
      if ((undefined1)local_a04 != '\0') {
        pIVar11 = std::
                  visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>&)_1_,matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,matchit::impl::IdBlock<mathiu::impl::Product>*>&>
                            ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                              *)local_9e8,&local_6c8->mBlock);
        pPVar12 = std::
                  visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Product,mathiu::impl::Product*,mathiu::impl::Product_const*>const&>
                            ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
                              *)local_9e8,
                             &(pIVar11->super_IdBlockBase<mathiu::impl::Product>).mVariant);
        p_Var14 = (pPVar12->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pIVar11 = std::
                  visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>&)_1_,matchit::impl::Id<mathiu::impl::Product>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::Product>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::Product>,matchit::impl::IdBlock<mathiu::impl::Product>*>&>
                            ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                              *)local_9e8,&local_6c8->mBlock);
        pPVar12 = std::
                  visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const&)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product_const*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(mathiu::impl::Product*)_1_,matchit::impl::IdBlock<mathiu::impl::Product>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::Product,mathiu::impl::Product*,mathiu::impl::Product_const*>const&>
                            ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
                              *)local_9e8,
                             &(pIVar11->super_IdBlockBase<mathiu::impl::Product>).mVariant);
        p_Var21 = &(pPVar12->super_ExprPtrMap)._M_t._M_impl.super__Rb_tree_header;
        p_Stack_930 = (_Base_ptr)&_Stack_940;
        local_938 = (_Base_ptr)0x0;
        local_948 = (undefined1  [8])0x0;
        _Stack_940._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        sStack_920 = 0;
        local_928 = p_Stack_930;
        if ((_Rb_tree_header *)p_Var14 != p_Var21) {
          local_9a0 = local_6c0;
          local_9a8 = local_6b8;
          do {
            std::
            _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
            ::_Rb_tree(&local_848,
                       (_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                        *)local_948);
            solve((impl *)&local_818,(ExprPtr *)&p_Var14[1]._M_left,&local_9a0->first,
                  (ExprPtr *)local_9a8);
            __src = (_Compatible_tree<mathiu::impl::ExprPtrLess> *)
                    std::
                    get<13ul,int,mathiu::impl::Fraction,mathiu::impl::Symbol,mathiu::impl::Pi,mathiu::impl::E,mathiu::impl::I,mathiu::impl::Infinity,mathiu::impl::Sum,mathiu::impl::Product,mathiu::impl::Power,mathiu::impl::Log,mathiu::impl::Sin,mathiu::impl::Arctan,mathiu::impl::Set,mathiu::impl::List,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>,mathiu::impl::PieceWise,mathiu::impl::Pair,std::pair<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>,std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,mathiu::impl::True,mathiu::impl::False,mathiu::impl::Logical,mathiu::impl::SetOp>
                              (local_818);
            std::
            _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
            ::_M_merge_unique<mathiu::impl::ExprPtrLess>(&local_848,__src);
            if (local_810 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_810);
            }
            if (local_848._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
              _Stack_9e0._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((ulong)_Stack_9e0._M_pi._4_4_ << 0x20);
              local_9d8 = (_Base_ptr)0x0;
              psVar13 = &local_9c0;
              local_9d0 = (_Base_ptr)&_Stack_9e0;
              p_Stack_9c8 = (_Base_ptr)&_Stack_9e0;
            }
            else {
              _Stack_9e0._M_pi._0_4_ = local_848._M_impl.super__Rb_tree_header._M_header._M_color;
              local_9d8 = local_848._M_impl.super__Rb_tree_header._M_header._M_parent;
              local_9d0 = local_848._M_impl.super__Rb_tree_header._M_header._M_left;
              p_Stack_9c8 = local_848._M_impl.super__Rb_tree_header._M_header._M_right;
              (local_848._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                   (_Base_ptr)&_Stack_9e0;
              local_9c0 = local_848._M_impl.super__Rb_tree_header._M_node_count;
              local_848._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_848._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_848._M_impl.super__Rb_tree_header._M_header;
              psVar13 = &local_848._M_impl.super__Rb_tree_header._M_node_count;
              local_848._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_848._M_impl.super__Rb_tree_header._M_header._M_left;
            }
            *psVar13 = 0;
            std::
            _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
            ::clear((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                     *)local_948);
            if (local_9d8 != (_Base_ptr)0x0) {
              _Stack_940._M_pi._0_4_ = (_Rb_tree_color)_Stack_9e0._M_pi;
              local_938 = local_9d8;
              p_Stack_930 = local_9d0;
              local_928 = p_Stack_9c8;
              local_9d8->_M_parent = (_Base_ptr)&_Stack_940;
              sStack_920 = local_9c0;
              local_9d8 = (_Base_ptr)0x0;
              local_9c0 = 0;
              local_9d0 = (_Base_ptr)&_Stack_9e0;
              p_Stack_9c8 = (_Base_ptr)&_Stack_9e0;
            }
            std::
            _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
            ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                         *)local_9e8);
            std::
            _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
            ::~_Rb_tree(&local_848);
            p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
          } while ((_Rb_tree_header *)p_Var14 != p_Var21);
        }
        if (local_938 == (_Base_ptr)0x0) {
          psVar13 = &local_970;
          uStack_990 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((ulong)uStack_990._4_4_ << 0x20);
          local_988 = (_Base_ptr)0x0;
          local_980 = (_Base_ptr)&uStack_990;
          p_Stack_978 = (_Base_ptr)&uStack_990;
        }
        else {
          psVar13 = &sStack_920;
          uStack_990 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(uStack_990._4_4_,(_Rb_tree_color)_Stack_940._M_pi);
          local_988 = local_938;
          local_980 = p_Stack_930;
          p_Stack_978 = local_928;
          local_938->_M_parent = (_Base_ptr)&uStack_990;
          local_970 = sStack_920;
          local_938 = (_Base_ptr)0x0;
          p_Stack_930 = (_Base_ptr)&_Stack_940;
          local_928 = p_Stack_930;
        }
        *psVar13 = 0;
        std::
        _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
        ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                     *)local_948);
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
        p_Var15->_M_use_count = 1;
        p_Var15->_M_weak_count = 1;
        p_Var15->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00253718;
        p_Var1 = &p_Var15[1]._M_use_count;
        if (local_988 == (_Base_ptr)0x0) {
          p_Var15[1]._M_use_count = 0;
          p_Var15[2]._vptr__Sp_counted_base = (_func_int **)0x0;
          *(_Atomic_word **)&p_Var15[2]._M_use_count = p_Var1;
          p_Var15[3]._vptr__Sp_counted_base = (_func_int **)p_Var1;
          p_Var16 = &p_Var15[3]._M_use_count;
        }
        else {
          p_Var16 = (_Atomic_word *)&local_970;
          p_Var15[1]._M_use_count = (_Rb_tree_color)uStack_990;
          p_Var15[2]._vptr__Sp_counted_base = (_func_int **)local_988;
          *(_Base_ptr *)&p_Var15[2]._M_use_count = local_980;
          p_Var15[3]._vptr__Sp_counted_base = (_func_int **)p_Stack_978;
          local_988->_M_parent = (_Base_ptr)p_Var1;
          p_Var15[3]._M_use_count = (undefined4)local_970;
          p_Var15[3]._M_weak_count = local_970._4_4_;
          local_988 = (_Base_ptr)0x0;
          local_980 = (_Base_ptr)&uStack_990;
          p_Stack_978 = (_Base_ptr)&uStack_990;
        }
        *(size_t *)p_Var16 = 0;
        *(undefined1 *)&p_Var15[4]._M_use_count = 0xd;
        auVar22 = (undefined1  [8])(p_Var15 + 1);
        std::
        _Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
        ::~_Rb_tree((_Rb_tree<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>,_std::_Identity<std::shared_ptr<const_mathiu::impl::Expr>_>,_mathiu::impl::ExprPtrLess,_std::allocator<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                     *)local_998);
        if (_Var19._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var19._M_pi);
        }
      }
      _Var19._M_pi = p_Var15;
      if ((undefined1)local_a04 == '\0') {
        memset(&local_918,0,200);
        lVar9 = 8;
        do {
          *(undefined1 *)((long)&local_918 + lVar9) = 0;
          lVar9 = lVar9 + 0x10;
        } while (lVar9 != 200);
        local_858 = 0;
        bVar5 = matchit::impl::
                PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
                ::
                matchPatternImpl<std::shared_ptr<mathiu::impl::Expr_const>const&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                          (ex,&local_610,1,
                           (Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
                            *)&local_918);
        if (bVar5) {
          p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    (ex->super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
          local_9e8 = (undefined1  [8])(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if ((char)p_Var15[3]._M_use_count == '\x10') {
            local_9e8 = (undefined1  [8])p_Var15;
          }
          std::
          variant<std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
          ::operator=((variant<std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
                       *)(&local_918 + local_858 * 2),(PieceWise **)local_9e8);
          lVar9 = local_858 * 2;
          local_858 = local_858 + 1;
          value_02 = std::
                     get<4ul,std::monostate,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,int_const*,mathiu::impl::Product_const*,mathiu::impl::PieceWise_const*,bool>
                               ((variant<std::monostate,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_const_int_*,_const_mathiu::impl::Product_*,_const_mathiu::impl::PieceWise_*,_bool>
                                 *)(&local_918 + lVar9));
          bVar5 = matchit::impl::
                  PatternTraits<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>>
                  ::
                  matchPatternImpl<mathiu::impl::PieceWise_const*&,matchit::impl::Context<bool,std::tuple<mathiu::impl::RelationalKind,std::shared_ptr<mathiu::impl::Expr_const>,std::shared_ptr<mathiu::impl::Expr_const>>const*,bool,bool,int_const*,bool,bool,mathiu::impl::Product_const*,bool,bool,mathiu::impl::PieceWise_const*,bool>>
                            (value_02,&local_620,4,
                             (Context<bool,_const_std::tuple<mathiu::impl::RelationalKind,_std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_*,_bool,_bool,_const_int_*,_bool,_bool,_const_mathiu::impl::Product_*,_bool,_bool,_const_mathiu::impl::PieceWise_*,_bool>
                              *)&local_918);
          if (bVar5) {
            bVar5 = matchit::impl::Id<mathiu::impl::PieceWise>::
                    matchValue<mathiu::impl::PieceWise_const&>
                              ((Id<mathiu::impl::PieceWise> *)&local_650,*value_02);
            IVar20 = (IdProcess)bVar5;
            matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::PieceWise>_>::processIdImpl
                      ((Id<mathiu::impl::PieceWise> *)&local_650,5,IVar20);
            matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::PieceWise>_>::processIdImpl
                      ((Id<mathiu::impl::PieceWise> *)&local_650,4,(uint)bVar5);
          }
          else {
            IVar20 = kCANCEL;
          }
          matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::PieceWise>_>::processIdImpl
                    ((Id<mathiu::impl::PieceWise> *)&local_650,3,IVar20);
          matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::PieceWise>_>::processIdImpl
                    ((Id<mathiu::impl::PieceWise> *)&local_650,2,IVar20);
          matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::PieceWise>_>::processIdImpl
                    ((Id<mathiu::impl::PieceWise> *)&local_650,1,IVar20);
        }
        else {
          IVar20 = kCANCEL;
        }
        matchit::impl::PatternTraits<matchit::impl::Id<mathiu::impl::PieceWise>_>::processIdImpl
                  ((Id<mathiu::impl::PieceWise> *)&local_650,0,IVar20);
        if ((char)IVar20 != '\0') {
          pIVar17 = std::
                    visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::PieceWise>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::PieceWise>&)_1_,matchit::impl::Id<mathiu::impl::PieceWise>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::PieceWise>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::PieceWise>,matchit::impl::IdBlock<mathiu::impl::PieceWise>*>&>
                              ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                                *)local_9e8,&local_600->mBlock);
          pPVar18 = std::
                    visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::PieceWise>::get()const::_lambda(mathiu::impl::PieceWise_const&)_1_,matchit::impl::IdBlock<mathiu::impl::PieceWise>::get()const::_lambda(mathiu::impl::PieceWise_const*)_1_,matchit::impl::IdBlock<mathiu::impl::PieceWise>::get()const::_lambda(mathiu::impl::PieceWise*)_1_,matchit::impl::IdBlock<mathiu::impl::PieceWise>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::PieceWise,mathiu::impl::PieceWise*,mathiu::impl::PieceWise_const*>const&>
                              ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
                                *)local_9e8,
                               &(pIVar17->super_IdBlockBase<mathiu::impl::PieceWise>).mVariant);
          ex_03 = (pPVar18->
                  super_vector<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::allocator<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                  ).
                  super__Vector_base<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::allocator<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          pIVar17 = std::
                    visit<matchit::impl::Overload<matchit::impl::Id<mathiu::impl::PieceWise>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::PieceWise>&)_1_,matchit::impl::Id<mathiu::impl::PieceWise>::block()const::_lambda(matchit::impl::IdBlock<mathiu::impl::PieceWise>*)_1_>,std::variant<matchit::impl::IdBlock<mathiu::impl::PieceWise>,matchit::impl::IdBlock<mathiu::impl::PieceWise>*>&>
                              ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1321:44)>
                                *)local_9e8,&local_600->mBlock);
          pPVar18 = std::
                    visit<matchit::impl::Overload<matchit::impl::IdBlock<mathiu::impl::PieceWise>::get()const::_lambda(mathiu::impl::PieceWise_const&)_1_,matchit::impl::IdBlock<mathiu::impl::PieceWise>::get()const::_lambda(mathiu::impl::PieceWise_const*)_1_,matchit::impl::IdBlock<mathiu::impl::PieceWise>::get()const::_lambda(mathiu::impl::PieceWise*)_1_,matchit::impl::IdBlock<mathiu::impl::PieceWise>::get()const::_lambda(std::monostate_const&)_1_>,std::variant<std::monostate,mathiu::impl::PieceWise,mathiu::impl::PieceWise*,mathiu::impl::PieceWise_const*>const&>
                              ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1186:30),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1187:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1188:33),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O1__deps_matchit_src_include_matchit_h:1189:33)>
                                *)local_9e8,
                               &(pIVar17->super_IdBlockBase<mathiu::impl::PieceWise>).mVariant);
          piVar4 = local_5f0;
          var_00 = local_5f8;
          local_9a0 = (pPVar18->
                      super_vector<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::allocator<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                      ).
                      super__Vector_base<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>,_std::allocator<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          local_948 = (undefined1  [8])false_;
          _Stack_940._M_pi = DAT_0025d688;
          if (DAT_0025d688 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              DAT_0025d688->_M_use_count = DAT_0025d688->_M_use_count + 1;
              UNLOCK();
            }
            else {
              DAT_0025d688->_M_use_count = DAT_0025d688->_M_use_count + 1;
            }
          }
          local_9a8 = (impl *)CONCAT44(local_9a8._4_4_,IVar20);
          if (ex_03 != local_9a0) {
            do {
              solveInequation((impl *)&local_848,&ex_03->second,var_00,(ExprPtr *)piVar4);
              solve((impl *)local_9e8,&ex_03->first,var_00,(ExprPtr *)&local_848);
              union_((impl *)local_998,(ExprPtr *)local_948,(ExprPtr *)local_9e8);
              if (_Stack_9e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_9e0._M_pi);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  CONCAT44(local_848._M_impl.super__Rb_tree_header._M_header._4_4_,
                           local_848._M_impl.super__Rb_tree_header._M_header._M_color) !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           CONCAT44(local_848._M_impl.super__Rb_tree_header._M_header._4_4_,
                                    local_848._M_impl.super__Rb_tree_header._M_header._M_color));
              }
              _Var3._M_pi = _Stack_940._M_pi;
              _Stack_940._M_pi = uStack_990;
              local_948 = local_998;
              local_998 = (undefined1  [8])0x0;
              uStack_990 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
              }
              if (uStack_990 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(uStack_990);
              }
              ex_03 = ex_03 + 1;
            } while (ex_03 != local_9a0);
          }
          _Var3._M_pi = _Stack_940._M_pi;
          auVar22 = local_948;
          if (_Var19._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var19._M_pi);
          }
          _Var19._M_pi = _Var3._M_pi;
          IVar20 = (IdProcess)local_9a8;
        }
        if ((char)IVar20 == '\0') {
          solvePoly((ExprPtr *)&local_918,ex);
          intersect((impl *)local_9e8,(ExprPtr *)&local_918,(ExprPtr *)local_9b0);
          if ((_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)
              auStack_910._0_8_ !=
              (_Variadic_union<mathiu::impl::Product_*,_const_mathiu::impl::Product_*>)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_910._0_8_);
          }
          _Var3._M_pi = _Stack_9e0._M_pi;
          auVar22 = local_9e8;
          local_9e8 = (undefined1  [8])0x0;
          _Stack_9e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (_Var19._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var19._M_pi);
          }
          _Var19._M_pi = _Var3._M_pi;
          if (_Stack_9e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_9e0._M_pi);
          }
        }
      }
    }
  }
LAB_001cec83:
  piVar4 = local_9b8;
  *(undefined1 (*) [8])local_9b8 = auVar22;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_9b8 + 8) = _Var19._M_pi;
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage(&local_650);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage(&local_3b0);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage(&local_478);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage(&local_1e8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage(&local_428);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(&local_730);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(&local_190);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(&local_2b8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(&local_88);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage(&local_128);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  if (local_750 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_750);
  }
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_7f0.mPatterns.
                          super__Tuple_impl<0UL,_mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                     );
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_7f0);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_348.
                          super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                     );
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_348);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_5d0.
                          super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                     );
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_5d0);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_548.
                          super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                     );
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_548);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_250.mPatterns.
                          super__Tuple_impl<0UL,_mathiu::impl::RelationalKind,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                          .
                          super__Tuple_impl<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>_>
                          .
                          super__Head_base<1UL,_matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>,_false>
                     );
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                       *)&local_250);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::PieceWise>,_matchit::impl::IdBlock<mathiu::impl::PieceWise>_*>
                       *)local_3f8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_4e0);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~_Variant_storage(&local_4b8);
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                       *)local_e0);
  _Var19._M_pi = extraout_RDX;
  if (local_968[0] != local_958) {
    operator_delete(local_968[0],local_958[0] + 1);
    _Var19._M_pi = extraout_RDX_00;
  }
  EVar23.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var19._M_pi;
  EVar23.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)piVar4;
  return (ExprPtr)EVar23.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExprPtr solve(ExprPtr const &ex, ExprPtr const &var, ExprPtr const &domain)
    {
#if DEBUG
        std::cout << "solve: " << toString(ex) << ",\t" << toString(var) << ",\t" << toString(domain) << std::endl;
#endif // DEBUG

        auto const var_ = std::get<Symbol>(*var);
        using namespace matchit;
        const auto freeOfVar = meet([&](auto &&e)
                                    { return freeOf(e, var); });
        Id<Product> iP;
        Id<ExprPtr> iE1, iE2;
        Id<PieceWise> iPieceWise;
        return match(ex)(
            pattern | some(as<Relational>(ds(RelationalKind::kEQUAL, iE1, iE2))) = [&]
            { return solve(expand(*iE1 - *iE2), var, domain); },
            pattern | some(as<Integer>(0)) = expr(set(var)),
            pattern | freeOfVar = expr(set()),
            pattern | some(as<Product>(iP)) = [&]
            {
                auto solutionSet = std::accumulate((*iP).begin(), (*iP).end(), Set{}, [&](Set solutions, auto &&e)
                                                   {
                                                       solutions.merge(const_cast<Set &>(std::get<Set>(*solve(e.second, var, domain)))); // it is safe to const_cast a temp.
                                                       return solutions;
                                                   });
                return makeSharedExprPtr(std::move(solutionSet));
            },
            pattern | some(as<PieceWise>(iPieceWise)) = [&]
            { return std::accumulate((*iPieceWise).begin(), (*iPieceWise).end(), false_, [&](auto &&result, auto &&e)
                                     { return union_(result, solve(e.first, var, solveInequation(e.second, var, domain))); }); },
            // assume is poly
            pattern | _ = [&]
            {
                auto const sol = solvePoly(ex, var);
                return intersect(sol, domain);
            });
    }